

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttf.c
# Opt level: O3

int render_glyph(ALLEGRO_FONT *f,ALLEGRO_COLOR color,int prev_ft_index,int ft_index,int32_t prev_ch,
                int32_t ch,float xpos,float ypos)

{
  _Bool _Var1;
  int iVar2;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  ALLEGRO_GLYPH glyph;
  ALLEGRO_GLYPH local_50;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  local_18._8_4_ = in_XMM1_Dc;
  local_18._0_8_ = color._8_8_;
  local_18._12_4_ = in_XMM1_Dd;
  local_28._8_4_ = in_XMM0_Dc;
  local_28._0_8_ = color._0_8_;
  local_28._12_4_ = in_XMM0_Dd;
  _Var1 = ttf_get_glyph_worker(f,prev_ft_index,ft_index,prev_ch,ch,&local_50);
  iVar2 = 0;
  if ((_Var1) && (iVar2 = local_50.advance, local_50.bitmap != (ALLEGRO_BITMAP *)0x0)) {
    al_draw_tinted_bitmap_region
              (local_28._0_4_,local_18._0_4_,(float)local_50.x,(float)local_50.y,(float)local_50.w,
               (float)local_50.h,(float)local_50.kerning + (float)local_50.offset_x + xpos,
               (float)local_50.offset_y + ypos,local_50.bitmap,0);
    iVar2 = local_50.advance;
  }
  return iVar2;
}

Assistant:

static int render_glyph(ALLEGRO_FONT const *f, ALLEGRO_COLOR color,
   int prev_ft_index, int ft_index, int32_t prev_ch, int32_t ch, float xpos, float ypos)
{
   ALLEGRO_GLYPH glyph;

   if (ttf_get_glyph_worker(f, prev_ft_index, ft_index, prev_ch, ch, &glyph) == false)
      return 0;

   if (glyph.bitmap != NULL) {
      al_draw_tinted_bitmap_region(
         glyph.bitmap, color,
         glyph.x, glyph.y, glyph.w, glyph.h,
         xpos + glyph.offset_x + glyph.kerning,
         ypos + glyph.offset_y,
         0
      );
   }

   return glyph.advance;
}